

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to1_int8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack8to1_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uint _c;
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  undefined1 auVar11 [14];
  undefined1 auVar12 [12];
  unkbyte10 Var13;
  undefined1 auVar14 [14];
  undefined1 auVar15 [12];
  unkbyte10 Var16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [12];
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  undefined1 auVar29 [14];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [14];
  undefined1 auVar36 [12];
  undefined1 auVar37 [14];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [14];
  undefined1 auVar42 [12];
  undefined1 auVar43 [14];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  unkbyte10 Var46;
  int iVar47;
  undefined8 *puVar48;
  long lVar49;
  ulong uVar50;
  uint uVar51;
  ulong uVar52;
  long lVar53;
  ulong uVar54;
  int *piVar55;
  int *piVar56;
  undefined4 *puVar57;
  int *piVar58;
  int q;
  ulong uVar59;
  long lVar60;
  int *piVar61;
  undefined4 *puVar62;
  undefined1 (*pauVar63) [16];
  char *kptr0;
  ulong uVar64;
  void *pvVar65;
  int iVar66;
  undefined8 *puVar67;
  bool bVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  undefined1 auVar72 [16];
  int iVar73;
  char cVar79;
  char cVar80;
  char cVar82;
  int iVar83;
  char cVar84;
  char cVar85;
  short sVar86;
  undefined1 auVar74 [12];
  char cVar81;
  int iVar87;
  int iVar88;
  undefined1 auVar76 [16];
  int iVar89;
  int iVar101;
  short sVar102;
  undefined1 auVar90 [12];
  undefined1 auVar92 [16];
  int iVar103;
  int iVar104;
  undefined1 auVar93 [16];
  undefined4 uVar105;
  short sVar119;
  short sVar120;
  undefined1 auVar108 [12];
  undefined1 auVar110 [12];
  undefined1 auVar111 [12];
  undefined1 auVar116 [16];
  undefined4 uVar121;
  short sVar138;
  undefined1 auVar124 [12];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  short sVar165;
  short sVar166;
  short sVar167;
  short sVar168;
  undefined1 auVar139 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar157 [16];
  int iVar169;
  int iVar170;
  int iVar181;
  int iVar182;
  int iVar183;
  undefined1 auVar172 [16];
  int iVar184;
  short sVar192;
  short sVar193;
  short sVar194;
  short sVar196;
  undefined1 auVar185 [12];
  short sVar195;
  undefined1 auVar187 [12];
  undefined1 auVar189 [16];
  short sVar197;
  short sVar205;
  undefined1 auVar199 [12];
  undefined1 auVar200 [12];
  undefined1 auVar206 [12];
  short sVar219;
  undefined1 auVar207 [12];
  short sVar218;
  undefined1 auVar208 [16];
  undefined1 auVar220 [12];
  short sVar233;
  undefined1 auVar221 [12];
  short sVar232;
  undefined1 auVar222 [16];
  short sVar234;
  short sVar247;
  short sVar248;
  short sVar249;
  short sVar250;
  short sVar251;
  short sVar252;
  undefined1 auVar237 [16];
  short sVar253;
  undefined1 auVar239 [16];
  short sVar254;
  undefined1 auVar261 [16];
  int iVar262;
  int iVar263;
  undefined1 auVar264 [16];
  undefined1 local_148 [64];
  size_t local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  void *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined1 local_58 [16];
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar75 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar91 [16];
  undefined6 uVar106;
  undefined8 uVar107;
  undefined1 auVar109 [12];
  undefined1 auVar114 [16];
  undefined1 auVar112 [14];
  undefined1 auVar113 [14];
  undefined1 auVar118 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined6 uVar122;
  undefined8 uVar123;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar125 [12];
  undefined1 auVar127 [16];
  undefined1 auVar126 [14];
  undefined1 auVar128 [16];
  undefined1 auVar140 [16];
  undefined1 auVar150 [16];
  undefined1 auVar158 [16];
  undefined1 auVar141 [16];
  undefined1 auVar151 [16];
  undefined1 auVar159 [16];
  undefined1 auVar142 [16];
  undefined1 auVar152 [16];
  undefined1 auVar160 [16];
  undefined1 auVar143 [16];
  undefined1 auVar153 [16];
  undefined1 auVar161 [16];
  undefined1 auVar144 [16];
  undefined1 auVar154 [16];
  undefined1 auVar162 [16];
  undefined1 auVar145 [16];
  undefined1 auVar155 [16];
  undefined1 auVar163 [16];
  undefined1 auVar146 [16];
  undefined1 auVar156 [16];
  undefined1 auVar164 [16];
  undefined1 auVar173 [16];
  undefined1 auVar171 [12];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar186 [12];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar198 [12];
  undefined1 auVar201 [14];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar202 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar235 [12];
  undefined1 auVar236 [14];
  undefined1 auVar238 [16];
  undefined4 uVar255;
  undefined6 uVar256;
  undefined8 uVar257;
  undefined1 auVar258 [12];
  undefined1 auVar259 [14];
  undefined1 auVar260 [16];
  
  iVar47 = cpu_support_x86_xop();
  if (iVar47 != 0) {
    im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col,top_blob,kernel,opt);
    return;
  }
  uVar1 = bottom_im2col->w;
  lVar53 = (long)(int)uVar1;
  iVar47 = bottom_im2col->h;
  uVar51 = bottom_im2col->c;
  iVar2 = top_blob->c;
  local_108 = 0;
  local_148._16_8_ = 0;
  local_148._24_4_ = 0;
  local_148._0_8_ = (void *)0x0;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_148._32_8_ = (Allocator *)0x0;
  local_148._40_4_ = 0;
  local_148._44_4_ = 0;
  _c = (uVar1 & 1) + (uVar1 >> 1);
  if (lVar53 < 2) {
    _c = uVar1;
  }
  Mat::create((Mat *)local_148,iVar47 << (1 < lVar53),uVar51,_c,8,8,opt->workspace_allocator);
  uVar50 = 0;
  iVar69 = 0;
  if (0 < iVar47) {
    iVar69 = iVar47;
  }
  uVar54 = 0;
  if (0 < (int)uVar51) {
    uVar54 = (ulong)uVar51;
  }
  uVar64 = (ulong)(uint)((int)uVar1 >> 1);
  if ((int)uVar1 >> 1 < 1) {
    uVar64 = uVar50;
  }
  for (uVar52 = 0; uVar52 != uVar64; uVar52 = uVar52 + 1) {
    puVar57 = (undefined4 *)(local_108 * uVar52 * local_148._16_8_ + local_148._0_8_);
    for (uVar59 = 0; uVar59 != uVar54; uVar59 = uVar59 + 1) {
      puVar62 = (undefined4 *)
                ((long)bottom_im2col->data +
                bottom_im2col->cstep * bottom_im2col->elemsize * uVar59 + uVar50);
      iVar66 = iVar69;
      while (bVar68 = iVar66 != 0, iVar66 = iVar66 + -1, bVar68) {
        uVar105 = puVar62[1];
        uVar121 = puVar62[2];
        uVar255 = puVar62[3];
        *puVar57 = *puVar62;
        puVar57[1] = uVar105;
        puVar57[2] = uVar121;
        puVar57[3] = uVar255;
        puVar57 = puVar57 + 4;
        puVar62 = puVar62 + lVar53 * 2;
      }
    }
    uVar50 = uVar50 + 0x10;
  }
  uVar50 = (ulong)(int)(uVar1 & 0xfffffffe);
  lVar60 = uVar50 * 8;
  for (; (long)uVar50 < lVar53; uVar50 = uVar50 + 1) {
    uVar64 = (ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 | uVar50 & 0xffffffff;
    puVar48 = (undefined8 *)
              ((long)((int)((long)uVar64 % 2) + (int)((long)uVar64 / 2)) * local_108 *
               local_148._16_8_ + local_148._0_8_);
    pvVar3 = bottom_im2col->data;
    for (uVar64 = 0; uVar64 != uVar54; uVar64 = uVar64 + 1) {
      puVar67 = (undefined8 *)
                ((long)pvVar3 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar64 + lVar60);
      iVar66 = iVar69;
      while (bVar68 = iVar66 != 0, iVar66 = iVar66 + -1, bVar68) {
        *puVar48 = *puVar67;
        puVar48 = puVar48 + 1;
        puVar67 = puVar67 + lVar53;
      }
    }
    lVar60 = lVar60 + 8;
  }
  local_d0 = top_blob->cstep * top_blob->elemsize;
  uVar54 = 0;
  uVar50 = (ulong)(uVar51 * iVar47);
  if ((int)(uVar51 * iVar47) < 1) {
    uVar50 = uVar54;
  }
  local_d8 = top_blob->data;
  uVar64 = (ulong)(uint)(iVar2 >> 2);
  if (iVar2 >> 2 < 1) {
    uVar64 = uVar54;
  }
  for (; iVar47 = (int)uVar50, uVar54 != uVar64; uVar54 = uVar54 + 1) {
    piVar55 = (int *)(uVar54 * 4 * local_d0 + (long)local_d8);
    piVar56 = (int *)((uVar54 * 4 + 1) * local_d0 + (long)local_d8);
    piVar58 = (int *)((uVar54 * 4 + 2) * local_d0 + (long)local_d8);
    piVar61 = (int *)((uVar54 * 4 + 3) * local_d0 + (long)local_d8);
    lVar60 = kernel->cstep * kernel->elemsize * uVar54;
    pvVar3 = kernel->data;
    pvVar65 = (void *)local_148._0_8_;
    for (uVar52 = 0; (long)(uVar52 | 1) < lVar53; uVar52 = uVar52 + 2) {
      lVar49 = 0;
      auVar237 = (undefined1  [16])0x0;
      local_f8 = (undefined1  [16])0x0;
      iVar169 = 0;
      iVar181 = 0;
      iVar182 = 0;
      iVar183 = 0;
      local_e8 = (undefined1  [16])0x0;
      uVar59 = uVar50;
      auVar148 = (undefined1  [16])0x0;
      auVar189 = (undefined1  [16])0x0;
      iVar69 = 0;
      iVar66 = 0;
      iVar70 = 0;
      iVar71 = 0;
      iVar73 = 0;
      iVar83 = 0;
      iVar87 = 0;
      iVar88 = 0;
      while (iVar263 = iVar88, iVar184 = iVar87, iVar262 = iVar83, iVar170 = iVar73,
            iVar104 = iVar71, iVar103 = iVar70, iVar101 = iVar66, iVar89 = iVar69,
            auVar129 = auVar189, auVar116 = auVar148, iVar69 = (int)uVar59,
            uVar59 = (ulong)(iVar69 - 1), iVar66 = auVar237._4_4_, iVar70 = auVar237._8_4_,
            iVar71 = auVar237._12_4_, iVar69 != 0) {
        auVar147 = *(undefined1 (*) [16])((long)pvVar65 + lVar49);
        auVar146._0_14_ = auVar147._0_14_;
        auVar146[0xe] = auVar147[7];
        auVar146[0xf] = -(auVar147[7] < '\0');
        auVar145._14_2_ = auVar146._14_2_;
        auVar145._0_13_ = auVar147._0_13_;
        auVar145[0xd] = -(auVar147[6] < '\0');
        auVar144._13_3_ = auVar145._13_3_;
        auVar144._0_12_ = auVar147._0_12_;
        auVar144[0xc] = auVar147[6];
        auVar143._12_4_ = auVar144._12_4_;
        auVar143._0_11_ = auVar147._0_11_;
        auVar143[0xb] = -(auVar147[5] < '\0');
        auVar142._11_5_ = auVar143._11_5_;
        auVar142._0_10_ = auVar147._0_10_;
        auVar142[10] = auVar147[5];
        auVar141._10_6_ = auVar142._10_6_;
        auVar141._0_9_ = auVar147._0_9_;
        auVar141[9] = -(auVar147[4] < '\0');
        auVar140._9_7_ = auVar141._9_7_;
        auVar140._0_8_ = auVar147._0_8_;
        auVar140[8] = auVar147[4];
        Var10 = CONCAT91(CONCAT81(auVar140._8_8_,-(auVar147[3] < '\0')),auVar147[3]);
        auVar9._2_10_ = Var10;
        auVar9[1] = -(auVar147[2] < '\0');
        auVar9[0] = auVar147[2];
        auVar8._2_12_ = auVar9;
        auVar8[1] = -(auVar147[1] < '\0');
        auVar8[0] = auVar147[1];
        auVar139._0_2_ = CONCAT11(-(auVar147[0] < '\0'),auVar147[0]);
        auVar139._2_14_ = auVar8;
        sVar234 = CONCAT11(-(auVar147[8] < '\0'),auVar147[8]);
        uVar121 = CONCAT13(-(auVar147[9] < '\0'),CONCAT12(auVar147[9],sVar234));
        uVar122 = CONCAT15(-(auVar147[10] < '\0'),CONCAT14(auVar147[10],uVar121));
        uVar123 = CONCAT17(-(auVar147[0xb] < '\0'),CONCAT16(auVar147[0xb],uVar122));
        auVar235._0_10_ = CONCAT19(-(auVar147[0xc] < '\0'),CONCAT18(auVar147[0xc],uVar123));
        auVar235[10] = auVar147[0xd];
        auVar235[0xb] = -(auVar147[0xd] < '\0');
        auVar236[0xc] = auVar147[0xe];
        auVar236._0_12_ = auVar235;
        auVar236[0xd] = -(auVar147[0xe] < '\0');
        auVar238[0xe] = auVar147[0xf];
        auVar238._0_14_ = auVar236;
        auVar238[0xf] = -(auVar147[0xf] < '\0');
        auVar147 = *(undefined1 (*) [16])((long)pvVar3 + lVar49 * 2 + lVar60);
        auVar261 = *(undefined1 (*) [16])((long)pvVar3 + lVar49 * 2 + lVar60 + 0x10);
        auVar229._0_14_ = auVar147._0_14_;
        auVar229[0xe] = auVar147[7];
        auVar229[0xf] = -(auVar147[7] < '\0');
        auVar228._14_2_ = auVar229._14_2_;
        auVar228._0_13_ = auVar147._0_13_;
        auVar228[0xd] = -(auVar147[6] < '\0');
        auVar227._13_3_ = auVar228._13_3_;
        auVar227._0_12_ = auVar147._0_12_;
        auVar227[0xc] = auVar147[6];
        auVar226._12_4_ = auVar227._12_4_;
        auVar226._0_11_ = auVar147._0_11_;
        auVar226[0xb] = -(auVar147[5] < '\0');
        auVar225._11_5_ = auVar226._11_5_;
        auVar225._0_10_ = auVar147._0_10_;
        auVar225[10] = auVar147[5];
        auVar224._10_6_ = auVar225._10_6_;
        auVar224._0_9_ = auVar147._0_9_;
        auVar224[9] = -(auVar147[4] < '\0');
        auVar223._9_7_ = auVar224._9_7_;
        auVar223._0_8_ = auVar147._0_8_;
        auVar223[8] = auVar147[4];
        Var13 = CONCAT91(CONCAT81(auVar223._8_8_,-(auVar147[3] < '\0')),auVar147[3]);
        auVar12._2_10_ = Var13;
        auVar12[1] = -(auVar147[2] < '\0');
        auVar12[0] = auVar147[2];
        auVar11._2_12_ = auVar12;
        auVar11[1] = -(auVar147[1] < '\0');
        auVar11[0] = auVar147[1];
        auVar222._0_2_ = CONCAT11(-(auVar147[0] < '\0'),auVar147[0]);
        auVar222._2_14_ = auVar11;
        sVar197 = CONCAT11(-(auVar147[8] < '\0'),auVar147[8]);
        uVar105 = CONCAT13(-(auVar147[9] < '\0'),CONCAT12(auVar147[9],sVar197));
        uVar106 = CONCAT15(-(auVar147[10] < '\0'),CONCAT14(auVar147[10],uVar105));
        uVar107 = CONCAT17(-(auVar147[0xb] < '\0'),CONCAT16(auVar147[0xb],uVar106));
        auVar198._0_10_ = CONCAT19(-(auVar147[0xc] < '\0'),CONCAT18(auVar147[0xc],uVar107));
        auVar198[10] = auVar147[0xd];
        auVar198[0xb] = -(auVar147[0xd] < '\0');
        auVar201[0xc] = auVar147[0xe];
        auVar201._0_12_ = auVar198;
        auVar201[0xd] = -(auVar147[0xe] < '\0');
        auVar202[0xe] = auVar147[0xf];
        auVar202._0_14_ = auVar201;
        auVar202[0xf] = -(auVar147[0xf] < '\0');
        auVar215._0_14_ = auVar261._0_14_;
        auVar215[0xe] = auVar261[7];
        auVar215[0xf] = -(auVar261[7] < '\0');
        auVar214._14_2_ = auVar215._14_2_;
        auVar214._0_13_ = auVar261._0_13_;
        auVar214[0xd] = -(auVar261[6] < '\0');
        auVar213._13_3_ = auVar214._13_3_;
        auVar213._0_12_ = auVar261._0_12_;
        auVar213[0xc] = auVar261[6];
        auVar212._12_4_ = auVar213._12_4_;
        auVar212._0_11_ = auVar261._0_11_;
        auVar212[0xb] = -(auVar261[5] < '\0');
        auVar211._11_5_ = auVar212._11_5_;
        auVar211._0_10_ = auVar261._0_10_;
        auVar211[10] = auVar261[5];
        auVar210._10_6_ = auVar211._10_6_;
        auVar210._0_9_ = auVar261._0_9_;
        auVar210[9] = -(auVar261[4] < '\0');
        auVar209._9_7_ = auVar210._9_7_;
        auVar209._0_8_ = auVar261._0_8_;
        auVar209[8] = auVar261[4];
        Var16 = CONCAT91(CONCAT81(auVar209._8_8_,-(auVar261[3] < '\0')),auVar261[3]);
        auVar15._2_10_ = Var16;
        auVar15[1] = -(auVar261[2] < '\0');
        auVar15[0] = auVar261[2];
        auVar14._2_12_ = auVar15;
        auVar14[1] = -(auVar261[1] < '\0');
        auVar14[0] = auVar261[1];
        auVar208._0_2_ = CONCAT11(-(auVar261[0] < '\0'),auVar261[0]);
        auVar208._2_14_ = auVar14;
        sVar254 = CONCAT11(-(auVar261[8] < '\0'),auVar261[8]);
        uVar255 = CONCAT13(-(auVar261[9] < '\0'),CONCAT12(auVar261[9],sVar254));
        uVar256 = CONCAT15(-(auVar261[10] < '\0'),CONCAT14(auVar261[10],uVar255));
        uVar257 = CONCAT17(-(auVar261[0xb] < '\0'),CONCAT16(auVar261[0xb],uVar256));
        auVar258._0_10_ = CONCAT19(-(auVar261[0xc] < '\0'),CONCAT18(auVar261[0xc],uVar257));
        auVar258[10] = auVar261[0xd];
        auVar258[0xb] = -(auVar261[0xd] < '\0');
        auVar259[0xc] = auVar261[0xe];
        auVar259._0_12_ = auVar258;
        auVar259[0xd] = -(auVar261[0xe] < '\0');
        auVar260[0xe] = auVar261[0xf];
        auVar260._0_14_ = auVar259;
        auVar260[0xf] = -(auVar261[0xf] < '\0');
        sVar219 = auVar8._0_2_;
        sVar165 = auVar9._0_2_;
        sVar232 = (short)Var13;
        sVar194 = (short)Var10;
        sVar86 = sVar232 * sVar194;
        sVar166 = auVar140._8_2_;
        sVar167 = auVar142._10_2_;
        sVar168 = auVar144._12_2_;
        local_b8 = pmulhw(auVar139,auVar222);
        sVar195 = (short)((uint)uVar105 >> 0x10);
        sVar233 = (short)((uint6)uVar106 >> 0x20);
        sVar205 = (short)((ulong)uVar107 >> 0x30);
        sVar119 = sVar205 * sVar194;
        sVar120 = (short)((unkuint10)auVar198._0_10_ >> 0x40);
        local_c8 = pmulhw(auVar139,auVar202);
        sVar218 = (short)Var16;
        sVar102 = sVar218 * sVar194;
        auVar264 = pmulhw(auVar139,auVar208);
        sVar192 = (short)((uint)uVar255 >> 0x10);
        sVar193 = (short)((uint6)uVar256 >> 0x20);
        sVar138 = (short)((ulong)uVar257 >> 0x30);
        sVar194 = sVar138 * sVar194;
        sVar196 = (short)((unkuint10)auVar258._0_10_ >> 0x40);
        auVar147 = pmulhw(auVar139,auVar260);
        local_88 = pmulhw(auVar238,auVar222);
        sVar247 = (short)((uint)uVar121 >> 0x10);
        sVar248 = (short)((uint6)uVar122 >> 0x20);
        sVar249 = (short)((ulong)uVar123 >> 0x30);
        sVar232 = sVar232 * sVar249;
        sVar250 = (short)((unkuint10)auVar235._0_10_ >> 0x40);
        sVar251 = auVar235._10_2_;
        sVar252 = auVar236._12_2_;
        sVar253 = auVar238._14_2_;
        local_98 = pmulhw(auVar238,auVar202);
        sVar205 = sVar205 * sVar249;
        local_a8 = pmulhw(auVar238,auVar208);
        sVar218 = sVar218 * sVar249;
        sVar138 = sVar138 * sVar249;
        auVar261 = pmulhw(auVar260,auVar238);
        iVar69 = CONCAT22(local_b8._6_2_,sVar86);
        Var10 = CONCAT64(CONCAT42(iVar69,local_b8._4_2_),CONCAT22(auVar12._0_2_ * sVar165,sVar86));
        auVar17._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar17._2_2_ = local_b8._2_2_;
        auVar17._0_2_ = auVar11._0_2_ * sVar219;
        iVar73 = CONCAT22(local_c8._6_2_,sVar119);
        Var13 = CONCAT64(CONCAT42(iVar73,local_c8._4_2_),CONCAT22(sVar233 * sVar165,sVar119));
        auVar18._4_8_ = (long)((unkuint10)Var13 >> 0x10);
        auVar18._2_2_ = local_c8._2_2_;
        auVar18._0_2_ = sVar195 * sVar219;
        iVar83 = CONCAT22(auVar264._6_2_,sVar102);
        Var16 = CONCAT64(CONCAT42(iVar83,auVar264._4_2_),CONCAT22(auVar15._0_2_ * sVar165,sVar102));
        auVar19._4_8_ = (long)((unkuint10)Var16 >> 0x10);
        auVar19._2_2_ = auVar264._2_2_;
        auVar19._0_2_ = auVar14._0_2_ * sVar219;
        iVar87 = CONCAT22(auVar147._6_2_,sVar194);
        Var46 = CONCAT64(CONCAT42(iVar87,auVar147._4_2_),CONCAT22(sVar193 * sVar165,sVar194));
        auVar20._4_8_ = (long)((unkuint10)Var46 >> 0x10);
        auVar20._2_2_ = auVar147._2_2_;
        auVar20._0_2_ = sVar192 * sVar219;
        iVar88 = CONCAT22(local_b8._8_2_,auVar223._8_2_ * sVar166);
        auVar74._0_8_ = CONCAT26(local_b8._10_2_,CONCAT24(auVar225._10_2_ * sVar167,iVar88));
        auVar74._8_2_ = auVar227._12_2_ * sVar168;
        auVar74._10_2_ = local_b8._12_2_;
        auVar75._12_2_ = auVar228._14_2_ * auVar145._14_2_;
        auVar75._0_12_ = auVar74;
        auVar75._14_2_ = local_b8._14_2_;
        local_e8._4_4_ = local_e8._4_4_ + auVar17._0_4_ + (int)((ulong)auVar74._0_8_ >> 0x20);
        local_e8._0_4_ =
             local_e8._0_4_ + CONCAT22(local_b8._0_2_,auVar222._0_2_ * auVar139._0_2_) + iVar88;
        local_e8._8_4_ = local_e8._8_4_ + (int)((unkuint10)Var10 >> 0x10) + auVar74._8_4_;
        local_e8._12_4_ = local_e8._12_4_ + iVar69 + auVar75._12_4_;
        iVar69 = CONCAT22(local_c8._8_2_,sVar120 * sVar166);
        auVar108._0_8_ = CONCAT26(local_c8._10_2_,CONCAT24(auVar198._10_2_ * sVar167,iVar69));
        auVar108._8_2_ = auVar201._12_2_ * sVar168;
        auVar108._10_2_ = local_c8._12_2_;
        auVar114._12_2_ = auVar202._14_2_ * auVar145._14_2_;
        auVar114._0_12_ = auVar108;
        auVar114._14_2_ = local_c8._14_2_;
        iVar169 = iVar169 + CONCAT22(local_c8._0_2_,sVar197 * auVar139._0_2_) + iVar69;
        iVar181 = iVar181 + auVar18._0_4_ + (int)((ulong)auVar108._0_8_ >> 0x20);
        iVar182 = iVar182 + (int)((unkuint10)Var13 >> 0x10) + auVar108._8_4_;
        iVar183 = iVar183 + iVar73 + auVar114._12_4_;
        iVar69 = CONCAT22(auVar264._8_2_,auVar209._8_2_ * sVar166);
        auVar90._0_8_ = CONCAT26(auVar264._10_2_,CONCAT24(auVar211._10_2_ * sVar167,iVar69));
        auVar90._8_2_ = auVar213._12_2_ * sVar168;
        auVar90._10_2_ = auVar264._12_2_;
        auVar91._12_2_ = auVar214._14_2_ * auVar145._14_2_;
        auVar91._0_12_ = auVar90;
        auVar91._14_2_ = auVar264._14_2_;
        local_f8._4_4_ = local_f8._4_4_ + auVar19._0_4_ + (int)((ulong)auVar90._0_8_ >> 0x20);
        local_f8._0_4_ =
             local_f8._0_4_ + CONCAT22(auVar264._0_2_,auVar208._0_2_ * auVar139._0_2_) + iVar69;
        local_f8._8_4_ = local_f8._8_4_ + (int)((unkuint10)Var16 >> 0x10) + auVar90._8_4_;
        local_f8._12_4_ = local_f8._12_4_ + iVar83 + auVar91._12_4_;
        iVar69 = CONCAT22(auVar147._8_2_,sVar196 * sVar166);
        auVar185._0_8_ = CONCAT26(auVar147._10_2_,CONCAT24(auVar258._10_2_ * sVar167,iVar69));
        auVar185._8_2_ = auVar259._12_2_ * sVar168;
        auVar185._10_2_ = auVar147._12_2_;
        auVar188._12_2_ = auVar260._14_2_ * auVar145._14_2_;
        auVar188._0_12_ = auVar185;
        auVar188._14_2_ = auVar147._14_2_;
        auVar237._0_4_ = auVar237._0_4_ + CONCAT22(auVar147._0_2_,sVar254 * auVar139._0_2_) + iVar69
        ;
        auVar237._4_4_ = iVar66 + auVar20._0_4_ + (int)((ulong)auVar185._0_8_ >> 0x20);
        auVar237._8_4_ = iVar70 + (int)((unkuint10)Var46 >> 0x10) + auVar185._8_4_;
        auVar237._12_4_ = iVar71 + iVar87 + auVar188._12_4_;
        iVar88 = CONCAT22(local_88._6_2_,sVar232);
        Var10 = CONCAT64(CONCAT42(iVar88,local_88._4_2_),CONCAT22(auVar12._0_2_ * sVar248,sVar232));
        auVar21._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar21._2_2_ = local_88._2_2_;
        auVar21._0_2_ = auVar11._0_2_ * sVar247;
        iVar69 = CONCAT22(local_98._6_2_,sVar205);
        Var13 = CONCAT64(CONCAT42(iVar69,local_98._4_2_),CONCAT22(sVar233 * sVar248,sVar205));
        auVar22._4_8_ = (long)((unkuint10)Var13 >> 0x10);
        auVar22._2_2_ = local_98._2_2_;
        auVar22._0_2_ = sVar195 * sVar247;
        iVar66 = CONCAT22(local_a8._6_2_,sVar218);
        Var16 = CONCAT64(CONCAT42(iVar66,local_a8._4_2_),CONCAT22(auVar15._0_2_ * sVar248,sVar218));
        auVar23._4_8_ = (long)((unkuint10)Var16 >> 0x10);
        auVar23._2_2_ = local_a8._2_2_;
        auVar23._0_2_ = auVar14._0_2_ * sVar247;
        iVar71 = CONCAT22(auVar261._6_2_,sVar138);
        Var46 = CONCAT64(CONCAT42(iVar71,auVar261._4_2_),CONCAT22(sVar193 * sVar248,sVar138));
        auVar24._4_8_ = (long)((unkuint10)Var46 >> 0x10);
        auVar24._2_2_ = auVar261._2_2_;
        auVar24._0_2_ = sVar192 * sVar247;
        iVar73 = CONCAT22(local_88._8_2_,auVar223._8_2_ * sVar250);
        auVar220._0_8_ = CONCAT26(local_88._10_2_,CONCAT24(auVar225._10_2_ * sVar251,iVar73));
        auVar220._8_2_ = auVar227._12_2_ * sVar252;
        auVar220._10_2_ = local_88._12_2_;
        auVar230._12_2_ = auVar228._14_2_ * sVar253;
        auVar230._0_12_ = auVar220;
        auVar230._14_2_ = local_88._14_2_;
        iVar70 = CONCAT22(local_98._8_2_,sVar120 * sVar250);
        auVar199._0_8_ = CONCAT26(local_98._10_2_,CONCAT24(auVar198._10_2_ * sVar251,iVar70));
        auVar199._8_2_ = auVar201._12_2_ * sVar252;
        auVar199._10_2_ = local_98._12_2_;
        auVar203._12_2_ = auVar202._14_2_ * sVar253;
        auVar203._0_12_ = auVar199;
        auVar203._14_2_ = local_98._14_2_;
        auVar189._0_4_ = auVar129._0_4_ + CONCAT22(local_98._0_2_,sVar197 * sVar234) + iVar70;
        auVar189._4_4_ = auVar129._4_4_ + auVar22._0_4_ + (int)((ulong)auVar199._0_8_ >> 0x20);
        auVar189._8_4_ = auVar129._8_4_ + (int)((unkuint10)Var13 >> 0x10) + auVar199._8_4_;
        auVar189._12_4_ = auVar129._12_4_ + iVar69 + auVar203._12_4_;
        iVar69 = CONCAT22(local_a8._8_2_,auVar209._8_2_ * sVar250);
        auVar206._0_8_ = CONCAT26(local_a8._10_2_,CONCAT24(auVar211._10_2_ * sVar251,iVar69));
        auVar206._8_2_ = auVar213._12_2_ * sVar252;
        auVar206._10_2_ = local_a8._12_2_;
        auVar216._12_2_ = auVar214._14_2_ * sVar253;
        auVar216._0_12_ = auVar206;
        auVar216._14_2_ = local_a8._14_2_;
        auVar148._0_4_ = auVar116._0_4_ + CONCAT22(local_a8._0_2_,auVar208._0_2_ * sVar234) + iVar69
        ;
        auVar148._4_4_ = auVar116._4_4_ + auVar23._0_4_ + (int)((ulong)auVar206._0_8_ >> 0x20);
        auVar148._8_4_ = auVar116._8_4_ + (int)((unkuint10)Var16 >> 0x10) + auVar206._8_4_;
        auVar148._12_4_ = auVar116._12_4_ + iVar66 + auVar216._12_4_;
        iVar69 = CONCAT22(auVar261._8_2_,sVar196 * sVar250);
        auVar124._0_8_ = CONCAT26(auVar261._10_2_,CONCAT24(auVar258._10_2_ * sVar251,iVar69));
        auVar124._8_2_ = auVar259._12_2_ * sVar252;
        auVar124._10_2_ = auVar261._12_2_;
        auVar127._12_2_ = auVar260._14_2_ * sVar253;
        auVar127._0_12_ = auVar124;
        auVar127._14_2_ = auVar261._14_2_;
        lVar49 = lVar49 + 0x10;
        iVar69 = iVar89 + CONCAT22(auVar261._0_2_,sVar254 * sVar234) + iVar69;
        iVar66 = iVar101 + auVar24._0_4_ + (int)((ulong)auVar124._0_8_ >> 0x20);
        iVar70 = iVar103 + (int)((unkuint10)Var46 >> 0x10) + auVar124._8_4_;
        iVar71 = iVar104 + iVar71 + auVar127._12_4_;
        iVar73 = iVar170 + CONCAT22(local_88._0_2_,auVar222._0_2_ * sVar234) + iVar73;
        iVar83 = iVar262 + auVar21._0_4_ + (int)((ulong)auVar220._0_8_ >> 0x20);
        iVar87 = iVar184 + (int)((unkuint10)Var10 >> 0x10) + auVar220._8_4_;
        iVar88 = iVar263 + iVar88 + auVar230._12_4_;
        local_78 = auVar129;
        local_68 = iVar89;
        iStack_64 = iVar101;
        iStack_60 = iVar103;
        iStack_5c = iVar104;
        local_58 = auVar116;
        local_48 = iVar170;
        iStack_44 = iVar262;
        iStack_40 = iVar184;
        iStack_3c = iVar263;
      }
      *piVar55 = local_e8._12_4_ + local_e8._8_4_ + local_e8._4_4_ + local_e8._0_4_;
      *piVar56 = iVar183 + iVar182 + iVar181 + iVar169;
      *piVar58 = local_f8._12_4_ + local_f8._8_4_ + local_f8._4_4_ + local_f8._0_4_;
      *piVar61 = iVar71 + iVar70 + iVar66 + auVar237._0_4_;
      piVar55[1] = iVar263 + iVar184 + iVar262 + iVar170;
      piVar56[1] = auVar129._12_4_ + auVar129._8_4_ + auVar129._4_4_ + auVar129._0_4_;
      piVar58[1] = auVar116._12_4_ + auVar116._8_4_ + auVar116._4_4_ + auVar116._0_4_;
      piVar61[1] = iVar104 + iVar103 + iVar101 + iVar89;
      piVar55 = piVar55 + 2;
      piVar56 = piVar56 + 2;
      piVar58 = piVar58 + 2;
      piVar61 = piVar61 + 2;
      pvVar65 = (void *)((long)pvVar65 + local_108 * local_148._16_8_);
    }
    sVar4 = kernel->cstep;
    sVar5 = kernel->elemsize;
    pvVar3 = kernel->data;
    while (uVar51 = (uint)uVar52, (int)uVar51 < (int)uVar1) {
      iVar73 = 0;
      iVar83 = 0;
      iVar87 = 0;
      iVar88 = 0;
      lVar60 = 0;
      auVar72 = (undefined1  [16])0x0;
      auVar92 = (undefined1  [16])0x0;
      iVar69 = 0;
      iVar66 = 0;
      iVar70 = 0;
      iVar71 = 0;
      pauVar63 = (undefined1 (*) [16])(sVar4 * uVar54 * sVar5 + (long)pvVar3);
      while( true ) {
        iVar183 = auVar92._4_4_;
        iVar182 = auVar72._12_4_;
        iVar101 = auVar92._12_4_;
        iVar169 = auVar72._4_4_;
        iVar181 = auVar72._8_4_;
        iVar89 = auVar92._8_4_;
        if (iVar47 == (int)lVar60) break;
        uVar59 = *(ulong *)(local_148._0_8_ +
                           lVar60 * 8 +
                           (ulong)((uVar51 & 1) + ((uint)(uVar52 >> 1) & 0x7fffffff)) *
                           local_108 * local_148._16_8_);
        cVar79 = (char)(uVar59 >> 8);
        cVar80 = (char)(uVar59 >> 0x10);
        cVar81 = (char)(uVar59 >> 0x18);
        cVar82 = (char)(uVar59 >> 0x20);
        cVar84 = (char)(uVar59 >> 0x28);
        cVar85 = (char)(uVar59 >> 0x30);
        auVar246._8_6_ = 0;
        auVar246._0_8_ = uVar59;
        auVar246[0xe] = (char)(uVar59 >> 0x38);
        auVar246[0xf] = -((long)uVar59 < 0);
        auVar245._14_2_ = auVar246._14_2_;
        auVar245._8_5_ = 0;
        auVar245._0_8_ = uVar59;
        auVar245[0xd] = -(cVar85 < '\0');
        auVar244._13_3_ = auVar245._13_3_;
        auVar244._8_4_ = 0;
        auVar244._0_8_ = uVar59;
        auVar244[0xc] = cVar85;
        auVar243._12_4_ = auVar244._12_4_;
        auVar243._8_3_ = 0;
        auVar243._0_8_ = uVar59;
        auVar243[0xb] = -(cVar84 < '\0');
        auVar242._11_5_ = auVar243._11_5_;
        auVar242._8_2_ = 0;
        auVar242._0_8_ = uVar59;
        auVar242[10] = cVar84;
        auVar241._10_6_ = auVar242._10_6_;
        auVar241[8] = 0;
        auVar241._0_8_ = uVar59;
        auVar241[9] = -(cVar82 < '\0');
        auVar240._9_7_ = auVar241._9_7_;
        auVar240[8] = cVar82;
        auVar240._0_8_ = uVar59;
        Var10 = CONCAT91(CONCAT81(auVar240._8_8_,-(cVar81 < '\0')),cVar81);
        auVar26._2_10_ = Var10;
        auVar26[1] = -(cVar80 < '\0');
        auVar26[0] = cVar80;
        auVar25._2_12_ = auVar26;
        auVar25[1] = -(cVar79 < '\0');
        auVar25[0] = cVar79;
        auVar239._0_2_ = CONCAT11(-((char)uVar59 < '\0'),(char)uVar59);
        auVar239._2_14_ = auVar25;
        auVar116 = *pauVar63;
        auVar129 = pauVar63[1];
        auVar179._0_14_ = auVar116._0_14_;
        auVar179[0xe] = auVar116[7];
        auVar179[0xf] = -(auVar116[7] < '\0');
        auVar178._14_2_ = auVar179._14_2_;
        auVar178._0_13_ = auVar116._0_13_;
        auVar178[0xd] = -(auVar116[6] < '\0');
        auVar177._13_3_ = auVar178._13_3_;
        auVar177._0_12_ = auVar116._0_12_;
        auVar177[0xc] = auVar116[6];
        auVar176._12_4_ = auVar177._12_4_;
        auVar176._0_11_ = auVar116._0_11_;
        auVar176[0xb] = -(auVar116[5] < '\0');
        auVar175._11_5_ = auVar176._11_5_;
        auVar175._0_10_ = auVar116._0_10_;
        auVar175[10] = auVar116[5];
        auVar174._10_6_ = auVar175._10_6_;
        auVar174._0_9_ = auVar116._0_9_;
        auVar174[9] = -(auVar116[4] < '\0');
        auVar173._9_7_ = auVar174._9_7_;
        auVar173._0_8_ = auVar116._0_8_;
        auVar173[8] = auVar116[4];
        Var13 = CONCAT91(CONCAT81(auVar173._8_8_,-(auVar116[3] < '\0')),auVar116[3]);
        auVar28._2_10_ = Var13;
        auVar28[1] = -(auVar116[2] < '\0');
        auVar28[0] = auVar116[2];
        auVar27._2_12_ = auVar28;
        auVar27[1] = -(auVar116[1] < '\0');
        auVar27[0] = auVar116[1];
        auVar172._0_2_ = CONCAT11(-(auVar116[0] < '\0'),auVar116[0]);
        auVar172._2_14_ = auVar27;
        sVar86 = CONCAT11(-(auVar116[8] < '\0'),auVar116[8]);
        uVar121 = CONCAT13(-(auVar116[9] < '\0'),CONCAT12(auVar116[9],sVar86));
        uVar122 = CONCAT15(-(auVar116[10] < '\0'),CONCAT14(auVar116[10],uVar121));
        uVar123 = CONCAT17(-(auVar116[0xb] < '\0'),CONCAT16(auVar116[0xb],uVar122));
        auVar125._0_10_ = CONCAT19(-(auVar116[0xc] < '\0'),CONCAT18(auVar116[0xc],uVar123));
        auVar125[10] = auVar116[0xd];
        auVar125[0xb] = -(auVar116[0xd] < '\0');
        auVar126[0xc] = auVar116[0xe];
        auVar126._0_12_ = auVar125;
        auVar126[0xd] = -(auVar116[0xe] < '\0');
        auVar128[0xe] = auVar116[0xf];
        auVar128._0_14_ = auVar126;
        auVar128[0xf] = -(auVar116[0xf] < '\0');
        auVar156._0_14_ = auVar129._0_14_;
        auVar156[0xe] = auVar129[7];
        auVar156[0xf] = -(auVar129[7] < '\0');
        auVar155._14_2_ = auVar156._14_2_;
        auVar155._0_13_ = auVar129._0_13_;
        auVar155[0xd] = -(auVar129[6] < '\0');
        auVar154._13_3_ = auVar155._13_3_;
        auVar154._0_12_ = auVar129._0_12_;
        auVar154[0xc] = auVar129[6];
        auVar153._12_4_ = auVar154._12_4_;
        auVar153._0_11_ = auVar129._0_11_;
        auVar153[0xb] = -(auVar129[5] < '\0');
        auVar152._11_5_ = auVar153._11_5_;
        auVar152._0_10_ = auVar129._0_10_;
        auVar152[10] = auVar129[5];
        auVar151._10_6_ = auVar152._10_6_;
        auVar151._0_9_ = auVar129._0_9_;
        auVar151[9] = -(auVar129[4] < '\0');
        auVar150._9_7_ = auVar151._9_7_;
        auVar150._0_8_ = auVar129._0_8_;
        auVar150[8] = auVar129[4];
        Var16 = CONCAT91(CONCAT81(auVar150._8_8_,-(auVar129[3] < '\0')),auVar129[3]);
        auVar30._2_10_ = Var16;
        auVar30[1] = -(auVar129[2] < '\0');
        auVar30[0] = auVar129[2];
        auVar29._2_12_ = auVar30;
        auVar29[1] = -(auVar129[1] < '\0');
        auVar29[0] = auVar129[1];
        auVar149._0_2_ = CONCAT11(-(auVar129[0] < '\0'),auVar129[0]);
        auVar149._2_14_ = auVar29;
        sVar232 = CONCAT11(-(auVar129[8] < '\0'),auVar129[8]);
        uVar105 = CONCAT13(-(auVar129[9] < '\0'),CONCAT12(auVar129[9],sVar232));
        uVar106 = CONCAT15(-(auVar129[10] < '\0'),CONCAT14(auVar129[10],uVar105));
        uVar107 = CONCAT17(-(auVar129[0xb] < '\0'),CONCAT16(auVar129[0xb],uVar106));
        auVar109._0_10_ = CONCAT19(-(auVar129[0xc] < '\0'),CONCAT18(auVar129[0xc],uVar107));
        auVar109[10] = auVar129[0xd];
        auVar109[0xb] = -(auVar129[0xd] < '\0');
        auVar112[0xc] = auVar129[0xe];
        auVar112._0_12_ = auVar109;
        auVar112[0xd] = -(auVar129[0xe] < '\0');
        auVar115[0xe] = auVar129[0xf];
        auVar115._0_14_ = auVar112;
        auVar115[0xf] = -(auVar129[0xf] < '\0');
        sVar218 = auVar25._0_2_;
        sVar102 = auVar26._0_2_;
        sVar233 = (short)Var10;
        sVar195 = sVar233 * (short)Var13;
        sVar205 = auVar240._8_2_;
        sVar119 = auVar242._10_2_;
        sVar120 = auVar244._12_2_;
        auVar261 = pmulhw(auVar172,auVar239);
        sVar138 = sVar233 * (short)((ulong)uVar123 >> 0x30);
        auVar129 = pmulhw(auVar128,auVar239);
        sVar219 = sVar233 * (short)Var16;
        auVar147 = pmulhw(auVar149,auVar239);
        sVar233 = sVar233 * (short)((ulong)uVar107 >> 0x30);
        auVar116 = pmulhw(auVar115,auVar239);
        iVar103 = CONCAT22(auVar261._6_2_,sVar195);
        Var10 = CONCAT64(CONCAT42(iVar103,auVar261._4_2_),CONCAT22(sVar102 * auVar28._0_2_,sVar195))
        ;
        auVar31._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar31._2_2_ = auVar261._2_2_;
        auVar31._0_2_ = sVar218 * auVar27._0_2_;
        iVar104 = CONCAT22(auVar129._6_2_,sVar138);
        Var13 = CONCAT64(CONCAT42(iVar104,auVar129._4_2_),
                         CONCAT22(sVar102 * (short)((uint6)uVar122 >> 0x20),sVar138));
        auVar32._4_8_ = (long)((unkuint10)Var13 >> 0x10);
        auVar32._2_2_ = auVar129._2_2_;
        auVar32._0_2_ = sVar218 * (short)((uint)uVar121 >> 0x10);
        iVar170 = CONCAT22(auVar147._6_2_,sVar219);
        Var16 = CONCAT64(CONCAT42(iVar170,auVar147._4_2_),CONCAT22(sVar102 * auVar30._0_2_,sVar219))
        ;
        auVar33._4_8_ = (long)((unkuint10)Var16 >> 0x10);
        auVar33._2_2_ = auVar147._2_2_;
        auVar33._0_2_ = sVar218 * auVar29._0_2_;
        iVar262 = CONCAT22(auVar116._6_2_,sVar233);
        Var46 = CONCAT64(CONCAT42(iVar262,auVar116._4_2_),
                         CONCAT22(sVar102 * (short)((uint6)uVar106 >> 0x20),sVar233));
        auVar34._4_8_ = (long)((unkuint10)Var46 >> 0x10);
        auVar34._2_2_ = auVar116._2_2_;
        auVar34._0_2_ = sVar218 * (short)((uint)uVar105 >> 0x10);
        iVar184 = CONCAT22(auVar261._8_2_,sVar205 * auVar173._8_2_);
        auVar186._0_8_ = CONCAT26(auVar261._10_2_,CONCAT24(sVar119 * auVar175._10_2_,iVar184));
        auVar186._8_2_ = sVar120 * auVar177._12_2_;
        auVar186._10_2_ = auVar261._12_2_;
        auVar190._12_2_ = auVar245._14_2_ * auVar178._14_2_;
        auVar190._0_12_ = auVar186;
        auVar190._14_2_ = auVar261._14_2_;
        iVar69 = iVar69 + CONCAT22(auVar261._0_2_,auVar239._0_2_ * auVar172._0_2_) + iVar184;
        iVar66 = iVar66 + auVar31._0_4_ + (int)((ulong)auVar186._0_8_ >> 0x20);
        iVar70 = iVar70 + (int)((unkuint10)Var10 >> 0x10) + auVar186._8_4_;
        iVar71 = iVar71 + iVar103 + auVar190._12_4_;
        iVar103 = CONCAT22(auVar129._8_2_,sVar205 * (short)((unkuint10)auVar125._0_10_ >> 0x40));
        auVar200._0_8_ = CONCAT26(auVar129._10_2_,CONCAT24(sVar119 * auVar125._10_2_,iVar103));
        auVar200._8_2_ = sVar120 * auVar126._12_2_;
        auVar200._10_2_ = auVar129._12_2_;
        auVar204._12_2_ = auVar245._14_2_ * auVar128._14_2_;
        auVar204._0_12_ = auVar200;
        auVar204._14_2_ = auVar129._14_2_;
        auVar92._0_4_ = auVar92._0_4_ + CONCAT22(auVar129._0_2_,auVar239._0_2_ * sVar86) + iVar103;
        auVar92._4_4_ = iVar183 + auVar32._0_4_ + (int)((ulong)auVar200._0_8_ >> 0x20);
        auVar92._8_4_ = iVar89 + (int)((unkuint10)Var13 >> 0x10) + auVar200._8_4_;
        auVar92._12_4_ = iVar101 + iVar104 + auVar204._12_4_;
        iVar183 = CONCAT22(auVar147._8_2_,sVar205 * auVar150._8_2_);
        auVar207._0_8_ = CONCAT26(auVar147._10_2_,CONCAT24(sVar119 * auVar152._10_2_,iVar183));
        auVar207._8_2_ = sVar120 * auVar154._12_2_;
        auVar207._10_2_ = auVar147._12_2_;
        auVar217._12_2_ = auVar245._14_2_ * auVar155._14_2_;
        auVar217._0_12_ = auVar207;
        auVar217._14_2_ = auVar147._14_2_;
        auVar72._0_4_ =
             auVar72._0_4_ + CONCAT22(auVar147._0_2_,auVar239._0_2_ * auVar149._0_2_) + iVar183;
        auVar72._4_4_ = iVar169 + auVar33._0_4_ + (int)((ulong)auVar207._0_8_ >> 0x20);
        auVar72._8_4_ = iVar181 + (int)((unkuint10)Var16 >> 0x10) + auVar207._8_4_;
        auVar72._12_4_ = iVar182 + iVar170 + auVar217._12_4_;
        iVar169 = CONCAT22(auVar116._8_2_,sVar205 * (short)((unkuint10)auVar109._0_10_ >> 0x40));
        auVar221._0_8_ = CONCAT26(auVar116._10_2_,CONCAT24(sVar119 * auVar109._10_2_,iVar169));
        auVar221._8_2_ = sVar120 * auVar112._12_2_;
        auVar221._10_2_ = auVar116._12_2_;
        auVar231._12_2_ = auVar245._14_2_ * auVar115._14_2_;
        auVar231._0_12_ = auVar221;
        auVar231._14_2_ = auVar116._14_2_;
        iVar73 = iVar73 + CONCAT22(auVar116._0_2_,auVar239._0_2_ * sVar232) + iVar169;
        iVar83 = iVar83 + auVar34._0_4_ + (int)((ulong)auVar221._0_8_ >> 0x20);
        iVar87 = iVar87 + (int)((unkuint10)Var46 >> 0x10) + auVar221._8_4_;
        iVar88 = iVar88 + iVar262 + auVar231._12_4_;
        pauVar63 = pauVar63 + 2;
        lVar60 = lVar60 + 1;
      }
      *piVar55 = iVar71 + iVar70 + iVar66 + iVar69;
      *piVar56 = iVar101 + iVar89 + iVar183 + auVar92._0_4_;
      *piVar58 = iVar182 + iVar181 + iVar169 + auVar72._0_4_;
      *piVar61 = iVar88 + iVar87 + iVar83 + iVar73;
      piVar55 = piVar55 + 1;
      piVar56 = piVar56 + 1;
      piVar58 = piVar58 + 1;
      piVar61 = piVar61 + 1;
      uVar52 = (ulong)(uVar51 + 1);
    }
  }
  pvVar3 = top_blob->data;
  sVar4 = top_blob->cstep;
  sVar5 = top_blob->elemsize;
  for (uVar50 = (long)iVar2 & 0xfffffffffffffffc; (long)uVar50 < (long)iVar2; uVar50 = uVar50 + 1) {
    uVar54 = (ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 | uVar50 & 0xffffffff;
    lVar60 = (long)((int)((long)uVar54 % 4) + (int)((long)uVar54 / 4));
    sVar6 = kernel->cstep;
    sVar7 = kernel->elemsize;
    piVar55 = (int *)(sVar4 * sVar5 * uVar50 + (long)pvVar3);
    pvVar65 = kernel->data;
    for (uVar54 = 0; (long)(uVar54 | 1) < lVar53; uVar54 = uVar54 + 2) {
      pauVar63 = (undefined1 (*) [16])
                 ((uVar54 >> 1) * local_108 * local_148._16_8_ + local_148._0_8_);
      iVar73 = 0;
      iVar83 = 0;
      iVar87 = 0;
      iVar88 = 0;
      iVar169 = 0;
      iVar181 = 0;
      iVar182 = 0;
      iVar183 = 0;
      iVar89 = 0;
      iVar101 = 0;
      iVar103 = 0;
      iVar104 = 0;
      iVar69 = 0;
      iVar66 = 0;
      iVar70 = 0;
      iVar71 = 0;
      for (lVar49 = 0; iVar47 != (int)lVar49; lVar49 = lVar49 + 1) {
        auVar116 = *pauVar63;
        auVar164._0_14_ = auVar116._0_14_;
        auVar164[0xe] = auVar116[7];
        auVar164[0xf] = -(auVar116[7] < '\0');
        auVar163._14_2_ = auVar164._14_2_;
        auVar163._0_13_ = auVar116._0_13_;
        auVar163[0xd] = -(auVar116[6] < '\0');
        auVar162._13_3_ = auVar163._13_3_;
        auVar162._0_12_ = auVar116._0_12_;
        auVar162[0xc] = auVar116[6];
        auVar161._12_4_ = auVar162._12_4_;
        auVar161._0_11_ = auVar116._0_11_;
        auVar161[0xb] = -(auVar116[5] < '\0');
        auVar160._11_5_ = auVar161._11_5_;
        auVar160._0_10_ = auVar116._0_10_;
        auVar160[10] = auVar116[5];
        auVar159._10_6_ = auVar160._10_6_;
        auVar159._0_9_ = auVar116._0_9_;
        auVar159[9] = -(auVar116[4] < '\0');
        auVar158._9_7_ = auVar159._9_7_;
        auVar158._0_8_ = auVar116._0_8_;
        auVar158[8] = auVar116[4];
        Var10 = CONCAT91(CONCAT81(auVar158._8_8_,-(auVar116[3] < '\0')),auVar116[3]);
        auVar36._2_10_ = Var10;
        auVar36[1] = -(auVar116[2] < '\0');
        auVar36[0] = auVar116[2];
        auVar35._2_12_ = auVar36;
        auVar35[1] = -(auVar116[1] < '\0');
        auVar35[0] = auVar116[1];
        auVar157._0_2_ = CONCAT11(-(auVar116[0] < '\0'),auVar116[0]);
        auVar157._2_14_ = auVar35;
        sVar232 = CONCAT11(-(auVar116[8] < '\0'),auVar116[8]);
        uVar105 = CONCAT13(-(auVar116[9] < '\0'),CONCAT12(auVar116[9],sVar232));
        uVar106 = CONCAT15(-(auVar116[10] < '\0'),CONCAT14(auVar116[10],uVar105));
        uVar107 = CONCAT17(-(auVar116[0xb] < '\0'),CONCAT16(auVar116[0xb],uVar106));
        auVar110._0_10_ = CONCAT19(-(auVar116[0xc] < '\0'),CONCAT18(auVar116[0xc],uVar107));
        auVar110[10] = auVar116[0xd];
        auVar110[0xb] = -(auVar116[0xd] < '\0');
        auVar113[0xc] = auVar116[0xe];
        auVar113._0_12_ = auVar110;
        auVar113[0xd] = -(auVar116[0xe] < '\0');
        auVar117[0xe] = auVar116[0xf];
        auVar117._0_14_ = auVar113;
        auVar117[0xf] = -(auVar116[0xf] < '\0');
        uVar64 = *(ulong *)((long)pvVar65 + lVar49 * 8 + sVar6 * lVar60 * sVar7);
        cVar79 = (char)(uVar64 >> 8);
        cVar80 = (char)(uVar64 >> 0x10);
        cVar81 = (char)(uVar64 >> 0x18);
        cVar82 = (char)(uVar64 >> 0x20);
        cVar84 = (char)(uVar64 >> 0x28);
        cVar85 = (char)(uVar64 >> 0x30);
        auVar137._8_6_ = 0;
        auVar137._0_8_ = uVar64;
        auVar137[0xe] = (char)(uVar64 >> 0x38);
        auVar137[0xf] = -((long)uVar64 < 0);
        auVar136._14_2_ = auVar137._14_2_;
        auVar136._8_5_ = 0;
        auVar136._0_8_ = uVar64;
        auVar136[0xd] = -(cVar85 < '\0');
        auVar135._13_3_ = auVar136._13_3_;
        auVar135._8_4_ = 0;
        auVar135._0_8_ = uVar64;
        auVar135[0xc] = cVar85;
        auVar134._12_4_ = auVar135._12_4_;
        auVar134._8_3_ = 0;
        auVar134._0_8_ = uVar64;
        auVar134[0xb] = -(cVar84 < '\0');
        auVar133._11_5_ = auVar134._11_5_;
        auVar133._8_2_ = 0;
        auVar133._0_8_ = uVar64;
        auVar133[10] = cVar84;
        auVar132._10_6_ = auVar133._10_6_;
        auVar132[8] = 0;
        auVar132._0_8_ = uVar64;
        auVar132[9] = -(cVar82 < '\0');
        auVar131._9_7_ = auVar132._9_7_;
        auVar131[8] = cVar82;
        auVar131._0_8_ = uVar64;
        Var13 = CONCAT91(CONCAT81(auVar131._8_8_,-(cVar81 < '\0')),cVar81);
        auVar38._2_10_ = Var13;
        auVar38[1] = -(cVar80 < '\0');
        auVar38[0] = cVar80;
        auVar37._2_12_ = auVar38;
        auVar37[1] = -(cVar79 < '\0');
        auVar37[0] = cVar79;
        auVar130._0_2_ = CONCAT11(-((char)uVar64 < '\0'),(char)uVar64);
        auVar130._2_14_ = auVar37;
        sVar218 = (short)Var13;
        sVar86 = sVar218 * (short)Var10;
        auVar129 = pmulhw(auVar157,auVar130);
        sVar218 = sVar218 * (short)((ulong)uVar107 >> 0x30);
        auVar116 = pmulhw(auVar130,auVar117);
        iVar170 = CONCAT22(auVar129._6_2_,sVar86);
        Var10 = CONCAT64(CONCAT42(iVar170,auVar129._4_2_),
                         CONCAT22(auVar38._0_2_ * auVar36._0_2_,sVar86));
        auVar39._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar39._2_2_ = auVar129._2_2_;
        auVar39._0_2_ = auVar37._0_2_ * auVar35._0_2_;
        iVar73 = iVar73 + CONCAT22(auVar129._0_2_,auVar130._0_2_ * auVar157._0_2_);
        iVar83 = iVar83 + auVar39._0_4_;
        iVar87 = iVar87 + (int)((unkuint10)Var10 >> 0x10);
        iVar88 = iVar88 + iVar170;
        iVar170 = CONCAT22(auVar129._8_2_,auVar131._8_2_ * auVar158._8_2_);
        auVar171._0_8_ =
             CONCAT26(auVar129._10_2_,CONCAT24(auVar133._10_2_ * auVar160._10_2_,iVar170));
        auVar171._8_2_ = auVar135._12_2_ * auVar162._12_2_;
        auVar171._10_2_ = auVar129._12_2_;
        auVar180._12_2_ = auVar136._14_2_ * auVar163._14_2_;
        auVar180._0_12_ = auVar171;
        auVar180._14_2_ = auVar129._14_2_;
        iVar169 = iVar169 + iVar170;
        iVar181 = iVar181 + (int)((ulong)auVar171._0_8_ >> 0x20);
        iVar182 = iVar182 + auVar171._8_4_;
        iVar183 = iVar183 + auVar180._12_4_;
        iVar170 = CONCAT22(auVar116._6_2_,sVar218);
        Var10 = CONCAT64(CONCAT42(iVar170,auVar116._4_2_),
                         CONCAT22(auVar38._0_2_ * (short)((uint6)uVar106 >> 0x20),sVar218));
        auVar40._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar40._2_2_ = auVar116._2_2_;
        auVar40._0_2_ = auVar37._0_2_ * (short)((uint)uVar105 >> 0x10);
        iVar89 = iVar89 + CONCAT22(auVar116._0_2_,auVar130._0_2_ * sVar232);
        iVar101 = iVar101 + auVar40._0_4_;
        iVar103 = iVar103 + (int)((unkuint10)Var10 >> 0x10);
        iVar104 = iVar104 + iVar170;
        iVar170 = CONCAT22(auVar116._8_2_,
                           auVar131._8_2_ * (short)((unkuint10)auVar110._0_10_ >> 0x40));
        auVar187._0_8_ =
             CONCAT26(auVar116._10_2_,CONCAT24(auVar133._10_2_ * auVar110._10_2_,iVar170));
        auVar187._8_2_ = auVar135._12_2_ * auVar113._12_2_;
        auVar187._10_2_ = auVar116._12_2_;
        auVar191._12_2_ = auVar136._14_2_ * auVar117._14_2_;
        auVar191._0_12_ = auVar187;
        auVar191._14_2_ = auVar116._14_2_;
        iVar69 = iVar69 + iVar170;
        iVar66 = iVar66 + (int)((ulong)auVar187._0_8_ >> 0x20);
        iVar70 = iVar70 + auVar187._8_4_;
        iVar71 = iVar71 + auVar191._12_4_;
        pauVar63 = pauVar63 + 1;
      }
      *(ulong *)piVar55 =
           CONCAT44(iVar70 + iVar103 + iVar69 + iVar89 + iVar71 + iVar104 + iVar66 + iVar101,
                    iVar182 + iVar87 + iVar169 + iVar73 + iVar183 + iVar88 + iVar181 + iVar83);
      piVar55 = piVar55 + 2;
    }
    sVar6 = kernel->cstep;
    sVar7 = kernel->elemsize;
    pvVar65 = kernel->data;
    while (uVar51 = (uint)uVar54, (int)uVar51 < (int)uVar1) {
      iVar69 = 0;
      iVar66 = 0;
      iVar70 = 0;
      iVar71 = 0;
      iVar73 = 0;
      iVar83 = 0;
      iVar87 = 0;
      iVar88 = 0;
      for (lVar49 = 0; iVar47 != (int)lVar49; lVar49 = lVar49 + 1) {
        uVar64 = *(ulong *)(local_148._0_8_ +
                           lVar49 * 8 +
                           (ulong)((uVar51 & 1) + ((uint)(uVar54 >> 1) & 0x7fffffff)) *
                           local_108 * local_148._16_8_);
        cVar79 = (char)(uVar64 >> 8);
        cVar80 = (char)(uVar64 >> 0x10);
        cVar81 = (char)(uVar64 >> 0x18);
        cVar82 = (char)(uVar64 >> 0x20);
        cVar84 = (char)(uVar64 >> 0x28);
        cVar85 = (char)(uVar64 >> 0x30);
        auVar78._8_6_ = 0;
        auVar78._0_8_ = uVar64;
        auVar78[0xe] = (char)(uVar64 >> 0x38);
        auVar78[0xf] = -((long)uVar64 < 0);
        auVar77._14_2_ = auVar78._14_2_;
        auVar77._8_5_ = 0;
        auVar77._0_8_ = uVar64;
        auVar77[0xd] = -(cVar85 < '\0');
        auVar76._13_3_ = auVar77._13_3_;
        auVar76._8_4_ = 0;
        auVar76._0_8_ = uVar64;
        auVar76[0xc] = cVar85;
        auVar264._12_4_ = auVar76._12_4_;
        auVar264._8_3_ = 0;
        auVar264._0_8_ = uVar64;
        auVar264[0xb] = -(cVar84 < '\0');
        auVar261._11_5_ = auVar264._11_5_;
        auVar261._8_2_ = 0;
        auVar261._0_8_ = uVar64;
        auVar261[10] = cVar84;
        auVar147._10_6_ = auVar261._10_6_;
        auVar147[8] = 0;
        auVar147._0_8_ = uVar64;
        auVar147[9] = -(cVar82 < '\0');
        auVar129._9_7_ = auVar147._9_7_;
        auVar129[8] = cVar82;
        auVar129._0_8_ = uVar64;
        Var10 = CONCAT91(CONCAT81(auVar129._8_8_,-(cVar81 < '\0')),cVar81);
        auVar42._2_10_ = Var10;
        auVar42[1] = -(cVar80 < '\0');
        auVar42[0] = cVar80;
        auVar41._2_12_ = auVar42;
        auVar41[1] = -(cVar79 < '\0');
        auVar41[0] = cVar79;
        auVar116._0_2_ = CONCAT11(-((char)uVar64 < '\0'),(char)uVar64);
        auVar116._2_14_ = auVar41;
        uVar64 = *(ulong *)((long)pvVar65 + lVar49 * 8 + lVar60 * sVar6 * sVar7);
        cVar79 = (char)(uVar64 >> 8);
        cVar80 = (char)(uVar64 >> 0x10);
        cVar81 = (char)(uVar64 >> 0x18);
        cVar82 = (char)(uVar64 >> 0x20);
        cVar84 = (char)(uVar64 >> 0x28);
        cVar85 = (char)(uVar64 >> 0x30);
        auVar100._8_6_ = 0;
        auVar100._0_8_ = uVar64;
        auVar100[0xe] = (char)(uVar64 >> 0x38);
        auVar100[0xf] = -((long)uVar64 < 0);
        auVar99._14_2_ = auVar100._14_2_;
        auVar99._8_5_ = 0;
        auVar99._0_8_ = uVar64;
        auVar99[0xd] = -(cVar85 < '\0');
        auVar98._13_3_ = auVar99._13_3_;
        auVar98._8_4_ = 0;
        auVar98._0_8_ = uVar64;
        auVar98[0xc] = cVar85;
        auVar97._12_4_ = auVar98._12_4_;
        auVar97._8_3_ = 0;
        auVar97._0_8_ = uVar64;
        auVar97[0xb] = -(cVar84 < '\0');
        auVar96._11_5_ = auVar97._11_5_;
        auVar96._8_2_ = 0;
        auVar96._0_8_ = uVar64;
        auVar96[10] = cVar84;
        auVar95._10_6_ = auVar96._10_6_;
        auVar95[8] = 0;
        auVar95._0_8_ = uVar64;
        auVar95[9] = -(cVar82 < '\0');
        auVar94._9_7_ = auVar95._9_7_;
        auVar94[8] = cVar82;
        auVar94._0_8_ = uVar64;
        Var13 = CONCAT91(CONCAT81(auVar94._8_8_,-(cVar81 < '\0')),cVar81);
        auVar44._2_10_ = Var13;
        auVar44[1] = -(cVar80 < '\0');
        auVar44[0] = cVar80;
        auVar43._2_12_ = auVar44;
        auVar43[1] = -(cVar79 < '\0');
        auVar43[0] = cVar79;
        auVar93._0_2_ = CONCAT11(-((char)uVar64 < '\0'),(char)uVar64);
        auVar93._2_14_ = auVar43;
        sVar232 = (short)Var13 * (short)Var10;
        auVar147 = pmulhw(auVar93,auVar116);
        iVar169 = CONCAT22(auVar147._6_2_,sVar232);
        Var10 = CONCAT64(CONCAT42(iVar169,auVar147._4_2_),
                         CONCAT22(auVar44._0_2_ * auVar42._0_2_,sVar232));
        auVar45._4_8_ = (long)((unkuint10)Var10 >> 0x10);
        auVar45._2_2_ = auVar147._2_2_;
        auVar45._0_2_ = auVar43._0_2_ * auVar41._0_2_;
        iVar69 = iVar69 + CONCAT22(auVar147._0_2_,auVar93._0_2_ * auVar116._0_2_);
        iVar66 = iVar66 + auVar45._0_4_;
        iVar70 = iVar70 + (int)((unkuint10)Var10 >> 0x10);
        iVar71 = iVar71 + iVar169;
        iVar169 = CONCAT22(auVar147._8_2_,auVar94._8_2_ * auVar129._8_2_);
        auVar111._0_8_ =
             CONCAT26(auVar147._10_2_,CONCAT24(auVar96._10_2_ * auVar261._10_2_,iVar169));
        auVar111._8_2_ = auVar98._12_2_ * auVar76._12_2_;
        auVar111._10_2_ = auVar147._12_2_;
        auVar118._12_2_ = auVar99._14_2_ * auVar77._14_2_;
        auVar118._0_12_ = auVar111;
        auVar118._14_2_ = auVar147._14_2_;
        iVar73 = iVar73 + iVar169;
        iVar83 = iVar83 + (int)((ulong)auVar111._0_8_ >> 0x20);
        iVar87 = iVar87 + auVar111._8_4_;
        iVar88 = iVar88 + auVar118._12_4_;
      }
      *piVar55 = iVar88 + iVar71 + iVar83 + iVar66 + iVar87 + iVar70 + iVar73 + iVar69;
      piVar55 = piVar55 + 1;
      uVar54 = (ulong)(uVar51 + 1);
    }
  }
  piVar55 = (int *)CONCAT44(local_148._12_4_,local_148._8_4_);
  if (piVar55 != (int *)0x0) {
    LOCK();
    *piVar55 = *piVar55 + -1;
    UNLOCK();
    if (*piVar55 == 0) {
      if ((Allocator *)local_148._32_8_ == (Allocator *)0x0) {
        free((void *)local_148._0_8_);
      }
      else {
        (*(*(_func_int ***)local_148._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to1_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
#if !(__AVX512VNNI__ || __AVXVNNI__ || __AVX2__ || __XOP__)
#if NCNN_RUNTIME_CPU && NCNN_AVX512VNNI && __AVX512F__ && !__AVX512VNNI__
    if (ncnn::cpu_support_x86_avx512_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avx512vnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVXVNNI && __AVX2__ && !__AVXVNNI__
    if (ncnn::cpu_support_x86_avx_vnni())
    {
        im2col_sgemm_pack8to1_int8_sse_avxvnni(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_AVX2 && __AVX__ && !__AVX2__
    if (ncnn::cpu_support_x86_avx2())
    {
        im2col_sgemm_pack8to1_int8_sse_avx2(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif

#if NCNN_RUNTIME_CPU && NCNN_XOP && __SSE2__ && !__XOP__
    if (ncnn::cpu_support_x86_xop())
    {
        im2col_sgemm_pack8to1_int8_sse_xop(bottom_im2col, top_blob, kernel, opt);
        return;
    }
#endif
#endif

    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
#if __AVX2__
    if (size >= 4)
        tmp.create(4 * maxk, inch, size / 4 + (size % 4) / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#else
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
#endif
    {
#if __AVX2__
        int remain_size_start = 0;
        int nn_size = size >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            int64_t* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m256i _v = _mm256_loadu_si256((const __m256i*)img0);
                    _mm256_storeu_si256((__m256i*)tmpptr, _v);
                    tmpptr += 4;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;
#else
        int remain_size_start = 0;
        int nn_size = (size - remain_size_start) >> 1;
#endif

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
#if __AVX2__
            int64_t* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);
#endif

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    int nn_outch = 0;
    int remain_outch_start = 0;

    nn_outch = outch >> 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < nn_outch; pp++)
    {
        int p = pp * 4;

        int* outptr0 = top_blob.channel(p);
        int* outptr1 = top_blob.channel(p + 1);
        int* outptr2 = top_blob.channel(p + 2);
        int* outptr3 = top_blob.channel(p + 3);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();

            __m256i _sum04_15 = _mm256_setzero_si256();
            __m256i _sum14_05 = _mm256_setzero_si256();
            __m256i _sum06_17 = _mm256_setzero_si256();
            __m256i _sum16_07 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif

                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);
                __m256i _val32_16 = _mm256_permute4x64_epi64(_val23_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum04_15 = _mm256_dpwssd_epi32(_sum04_15, _val23_16, _w01_16);
                _sum14_05 = _mm256_dpwssd_epi32(_sum14_05, _val32_16, _w01_16);
                _sum06_17 = _mm256_dpwssd_epi32(_sum06_17, _val23_16, _w23_16);
                _sum16_07 = _mm256_dpwssd_epi32(_sum16_07, _val32_16, _w23_16);
#else
                __m256i _sl04_15 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh04_15 = _mm256_mulhi_epi16(_val23_16, _w01_16);
                __m256i _sl14_05 = _mm256_mullo_epi16(_val32_16, _w01_16);
                __m256i _sh14_05 = _mm256_mulhi_epi16(_val32_16, _w01_16);
                __m256i _sl06_17 = _mm256_mullo_epi16(_val23_16, _w23_16);
                __m256i _sh06_17 = _mm256_mulhi_epi16(_val23_16, _w23_16);
                __m256i _sl16_07 = _mm256_mullo_epi16(_val32_16, _w23_16);
                __m256i _sh16_07 = _mm256_mulhi_epi16(_val32_16, _w23_16);

                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpacklo_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpacklo_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpacklo_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpacklo_epi16(_sl16_07, _sh16_07));
                _sum04_15 = _mm256_add_epi32(_sum04_15, _mm256_unpackhi_epi16(_sl04_15, _sh04_15));
                _sum14_05 = _mm256_add_epi32(_sum14_05, _mm256_unpackhi_epi16(_sl14_05, _sh14_05));
                _sum06_17 = _mm256_add_epi32(_sum06_17, _mm256_unpackhi_epi16(_sl06_17, _sh06_17));
                _sum16_07 = _mm256_add_epi32(_sum16_07, _mm256_unpackhi_epi16(_sl16_07, _sh16_07));
#endif

                tmpptr += 32;
                kptr0 += 32;
            }

            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum04_15, _sum14_05);
                _tmp1 = _mm256_unpacklo_epi32(_sum06_17, _sum16_07);
                _tmp2 = _mm256_unpackhi_epi32(_sum04_15, _sum14_05);
                _tmp3 = _mm256_unpackhi_epi32(_sum06_17, _sum16_07);
                _sum04_15 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum14_05 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum06_17 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum16_07 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum14_05);
            _sum06_17 = _mm256_add_epi32(_sum06_17, _sum16_07);
            _sum04_15 = _mm256_add_epi32(_sum04_15, _sum06_17);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);
            _sum04_15 = _mm256_permutevar8x32_epi32(_sum04_15, _perm_mask);

            int sum[16];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
            _mm256_storeu_si256((__m256i*)(sum + 8), _sum04_15);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0[2] = sum[8];
            outptr1[2] = sum[9];
            outptr2[2] = sum[10];
            outptr3[2] = sum[11];
            outptr0[3] = sum[12];
            outptr1[3] = sum[13];
            outptr2[3] = sum[14];
            outptr3[3] = sum[15];
            outptr0 += 4;
            outptr1 += 4;
            outptr2 += 4;
            outptr3 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum00_11 = _mm256_setzero_si256();
            __m256i _sum10_01 = _mm256_setzero_si256();
            __m256i _sum02_13 = _mm256_setzero_si256();
            __m256i _sum12_03 = _mm256_setzero_si256();
#else
            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _val10_16 = _mm256_permute4x64_epi64(_val01_16, 78);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum00_11 = _mm256_dpwssd_epi32(_sum00_11, _val01_16, _w01_16);
                _sum10_01 = _mm256_dpwssd_epi32(_sum10_01, _val10_16, _w01_16);
                _sum02_13 = _mm256_dpwssd_epi32(_sum02_13, _val01_16, _w23_16);
                _sum12_03 = _mm256_dpwssd_epi32(_sum12_03, _val10_16, _w23_16);
#else
                __m256i _sl00_11 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_11 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl10_01 = _mm256_mullo_epi16(_val10_16, _w01_16);
                __m256i _sh10_01 = _mm256_mulhi_epi16(_val10_16, _w01_16);
                __m256i _sl02_13 = _mm256_mullo_epi16(_val01_16, _w23_16);
                __m256i _sh02_13 = _mm256_mulhi_epi16(_val01_16, _w23_16);
                __m256i _sl12_03 = _mm256_mullo_epi16(_val10_16, _w23_16);
                __m256i _sh12_03 = _mm256_mulhi_epi16(_val10_16, _w23_16);

                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpacklo_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpacklo_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpacklo_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpacklo_epi16(_sl12_03, _sh12_03));
                _sum00_11 = _mm256_add_epi32(_sum00_11, _mm256_unpackhi_epi16(_sl00_11, _sh00_11));
                _sum10_01 = _mm256_add_epi32(_sum10_01, _mm256_unpackhi_epi16(_sl10_01, _sh10_01));
                _sum02_13 = _mm256_add_epi32(_sum02_13, _mm256_unpackhi_epi16(_sl02_13, _sh02_13));
                _sum12_03 = _mm256_add_epi32(_sum12_03, _mm256_unpackhi_epi16(_sl12_03, _sh12_03));
#endif
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum00 = _mm_maddd_epi16(_val0, _w0, _sum00);
                _sum01 = _mm_maddd_epi16(_val0, _w1, _sum01);
                _sum02 = _mm_maddd_epi16(_val0, _w2, _sum02);
                _sum03 = _mm_maddd_epi16(_val0, _w3, _sum03);
                _sum10 = _mm_maddd_epi16(_val1, _w0, _sum10);
                _sum11 = _mm_maddd_epi16(_val1, _w1, _sum11);
                _sum12 = _mm_maddd_epi16(_val1, _w2, _sum12);
                _sum13 = _mm_maddd_epi16(_val1, _w3, _sum13);
#else
                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));
#endif
#endif

                tmpptr += 16;
                kptr0 += 32;
            }

#if __AVX2__
            // transpose 4x8
            {
                __m256i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm256_unpacklo_epi32(_sum00_11, _sum10_01);
                _tmp1 = _mm256_unpacklo_epi32(_sum02_13, _sum12_03);
                _tmp2 = _mm256_unpackhi_epi32(_sum00_11, _sum10_01);
                _tmp3 = _mm256_unpackhi_epi32(_sum02_13, _sum12_03);
                _sum00_11 = _mm256_unpacklo_epi64(_tmp0, _tmp1);
                _sum10_01 = _mm256_unpackhi_epi64(_tmp0, _tmp1);
                _sum02_13 = _mm256_unpacklo_epi64(_tmp2, _tmp3);
                _sum12_03 = _mm256_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum10_01);
            _sum02_13 = _mm256_add_epi32(_sum02_13, _sum12_03);
            _sum00_11 = _mm256_add_epi32(_sum00_11, _sum02_13);

            __m256i _perm_mask = _mm256_set_epi32(6, 3, 4, 1, 7, 2, 5, 0);
            _sum00_11 = _mm256_permutevar8x32_epi32(_sum00_11, _perm_mask);

            int sum[8];
            _mm256_storeu_si256((__m256i*)sum, _sum00_11);
#else
            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            int sum[8];
            _mm_storeu_si128((__m128i*)sum, _sum00);
            _mm_storeu_si128((__m128i*)(sum + 4), _sum10);
#endif

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0[1] = sum[4];
            outptr1[1] = sum[5];
            outptr2[1] = sum[6];
            outptr3[1] = sum[7];
            outptr0 += 2;
            outptr1 += 2;
            outptr2 += 2;
            outptr3 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_1 = _mm256_setzero_si256();
            __m256i _sum2_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_cvtepi8_epi16(_val);

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                __m256i _w23_16 = _mm256_cvtepi8_epi16(_w23);

                __m256i _valval = _mm256_inserti128_si256(_mm256_castsi128_si256(_val), _val, 1);

#if __AVXVNNI__ || __AVX512VNNI__
                _sum0_1 = _mm256_dpwssd_epi32(_sum0_1, _valval, _w01_16);
                _sum2_3 = _mm256_dpwssd_epi32(_sum2_3, _valval, _w23_16);
#else
                __m256i _sl0_1 = _mm256_mullo_epi16(_valval, _w01_16);
                __m256i _sh0_1 = _mm256_mulhi_epi16(_valval, _w01_16);
                __m256i _sl2_3 = _mm256_mullo_epi16(_valval, _w23_16);
                __m256i _sh2_3 = _mm256_mulhi_epi16(_valval, _w23_16);

                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpacklo_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpacklo_epi16(_sl2_3, _sh2_3));
                _sum0_1 = _mm256_add_epi32(_sum0_1, _mm256_unpackhi_epi16(_sl0_1, _sh0_1));
                _sum2_3 = _mm256_add_epi32(_sum2_3, _mm256_unpackhi_epi16(_sl2_3, _sh2_3));
#endif
#else
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                _val = _mm_cvtepi8_epi16(_val);
#else
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));
#endif

                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

#if __XOP__
                _sum0 = _mm_maddd_epi16(_val, _w0, _sum0);
                _sum1 = _mm_maddd_epi16(_val, _w1, _sum1);
                _sum2 = _mm_maddd_epi16(_val, _w2, _sum2);
                _sum3 = _mm_maddd_epi16(_val, _w3, _sum3);
#else
                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));
#endif
#endif

                tmpptr += 8;
                kptr0 += 32;
            }

#if __AVX2__
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_1, 0);
            __m128i _sum1 = _mm256_extracti128_si256(_sum0_1, 1);
            __m128i _sum2 = _mm256_extracti128_si256(_sum2_3, 0);
            __m128i _sum3 = _mm256_extracti128_si256(_sum2_3, 1);
#endif

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            int sum[4];
            _mm_storeu_si128((__m128i*)sum, _sum0);

            outptr0[0] = sum[0];
            outptr1[0] = sum[1];
            outptr2[0] = sum[2];
            outptr3[0] = sum[3];
            outptr0 += 1;
            outptr1 += 1;
            outptr2 += 1;
            outptr3 += 1;
        }
    }

    remain_outch_start += nn_outch << 2;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = remain_outch_start; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
#if __AVX2__
        for (; i + 3 < size; i += 4)
        {
            const signed char* tmpptr = tmp.channel(i / 4);
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
            __m256i _sum4_6 = _mm256_setzero_si256();
            __m256i _sum5_7 = _mm256_setzero_si256();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _val23 = _mm_loadu_si128((const __m128i*)(tmpptr + 16));
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);
                __m256i _val23_16 = _mm256_cvtepi8_epi16(_val23);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);
                __m256i _sl20_30 = _mm256_mullo_epi16(_val23_16, _w01_16);
                __m256i _sh20_30 = _mm256_mulhi_epi16(_val23_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
                _sum4_6 = _mm256_add_epi32(_sum4_6, _mm256_unpacklo_epi16(_sl20_30, _sh20_30));
                _sum5_7 = _mm256_add_epi32(_sum5_7, _mm256_unpackhi_epi16(_sl20_30, _sh20_30));

                tmpptr += 32;
                kptr0 += 8;
            }

            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            _sum4_6 = _mm256_add_epi32(_sum4_6, _sum5_7);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
            __m128i _sum4 = _mm256_extracti128_si256(_sum4_6, 0);
            __m128i _sum6 = _mm256_extracti128_si256(_sum4_6, 1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0[2] = _mm_reduce_add_epi32(_sum4);
            outptr0[3] = _mm_reduce_add_epi32(_sum6);
            outptr0 += 4;
        }
#endif
        for (; i + 1 < size; i += 2)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

#if __AVX2__
            __m256i _sum0_2 = _mm256_setzero_si256();
            __m256i _sum1_3 = _mm256_setzero_si256();
#else
            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();
#endif

            int j = 0;
            for (; j < nn; j++)
            {
#if __AVX2__
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m256i _val01_16 = _mm256_cvtepi8_epi16(_val01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
                __m256i _w01_16 = _mm256_cvtepi8_epi16(_w01);
                _w01_16 = _mm256_permute4x64_epi64(_w01_16, _MM_SHUFFLE(1, 0, 1, 0));

                __m256i _sl00_10 = _mm256_mullo_epi16(_val01_16, _w01_16);
                __m256i _sh00_10 = _mm256_mulhi_epi16(_val01_16, _w01_16);

                _sum0_2 = _mm256_add_epi32(_sum0_2, _mm256_unpacklo_epi16(_sl00_10, _sh00_10));
                _sum1_3 = _mm256_add_epi32(_sum1_3, _mm256_unpackhi_epi16(_sl00_10, _sh00_10));
#else
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl10, _sh10));
#endif

                tmpptr += 16;
                kptr0 += 8;
            }

#if __AVX2__
            _sum0_2 = _mm256_add_epi32(_sum0_2, _sum1_3);
            __m128i _sum0 = _mm256_extracti128_si256(_sum0_2, 0);
            __m128i _sum2 = _mm256_extracti128_si256(_sum0_2, 1);
#else
            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);
#endif

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0[1] = _mm_reduce_add_epi32(_sum2);
            outptr0 += 2;
        }
        for (; i < size; i++)
        {
#if __AVX2__
            const signed char* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
#else
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
#endif
            const signed char* kptr0 = kernel.channel(p / 4 + p % 4);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                __m128i _val01 = _mm_loadl_epi64((const __m128i*)tmpptr);
#if __SSE4_1__
                __m128i _val0 = _mm_cvtepi8_epi16(_val01);
#else
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
#endif

                __m128i _w01 = _mm_loadl_epi64((const __m128i*)kptr0);
#if __SSE4_1__
                __m128i _w0 = _mm_cvtepi8_epi16(_w01);
#else
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
#endif

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl00, _sh00));

                tmpptr += 8;
                kptr0 += 8;
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);

            outptr0[0] = _mm_reduce_add_epi32(_sum0);
            outptr0 += 1;
        }
    }
}